

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testNetBios(void)

{
  char buffer2 [1024];
  char local_408 [1024];
  
  puts("CKAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA");
  memset(local_408,0,0x400);
  local_408[0] = '*';
  local_408[1] = '\0';
  local_408[2] = '\0';
  local_408[3] = '\0';
  local_408[4] = '\0';
  local_408[5] = '\0';
  local_408[6] = '\0';
  local_408[7] = '\0';
  local_408[8] = '\0';
  local_408[9] = '\0';
  local_408[10] = '\0';
  local_408[0xb] = '\0';
  local_408[0xc] = '\0';
  local_408[0xd] = '\0';
  local_408[0xe] = '\0';
  local_408[0xf] = '\0';
  puts(local_408);
  return;
}

Assistant:

void
testNetBios() {
	const char* name = "*";

	char buffer[1024] = "CKAAAAAAA" "AAAAAAAAAAAAAAAA" "AAAAAAA"; //{ 0 };
	size_t length = 32; //encodeNetBiosName (buffer, name);
	printf("%s\n", buffer);

	char buffer2[1024] = { 0 };
	decodeNetBiosName(buffer2, buffer, length);
	printf("%s\n", buffer2);
}